

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_asin>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  long *in_RDI;
  float fVar44;
  undefined1 auVar45 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_asin op;
  Mat *m;
  __m256 final_approx;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 big_input_approx;
  __m256 is_big_input;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_three;
  __m256 magic_half_pi;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_one;
  __m256 magic_half_one;
  __m256 magic_negative_zero;
  __m128 final_approx_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 big_input_approx_1;
  __m128 is_big_input_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_three_1;
  __m128 magic_half_pi_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_one_1;
  __m128 magic_half_one_1;
  __m128 magic_negative_zero_1;
  undefined1 local_1690 [16];
  undefined1 local_1680 [32];
  int local_165c;
  undefined8 local_1658;
  undefined8 local_1650;
  undefined8 local_1648;
  undefined4 local_1640;
  long local_1638;
  undefined4 local_1630;
  undefined4 local_162c;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined4 local_1620;
  undefined8 local_1618;
  undefined1 (*local_1610) [32];
  int local_1608;
  int local_1604;
  int local_1600;
  int local_15fc;
  int local_15f8;
  int local_15f4;
  int local_15f0;
  undefined1 local_15e9 [9];
  long *local_15e0;
  undefined1 local_15d5;
  int local_15d4;
  undefined8 *local_15c8;
  undefined8 *local_15c0;
  undefined8 *local_15b0;
  undefined1 (*local_15a8) [32];
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined1 (*local_1570) [32];
  undefined1 (*local_1568) [32];
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined1 (*local_1550) [32];
  long local_1548;
  undefined4 local_153c;
  long local_1538;
  undefined1 (*local_1530) [32];
  undefined4 local_1524;
  int local_1520;
  int local_151c;
  undefined8 *local_1518;
  undefined4 local_150c;
  long local_1508;
  undefined8 *local_14f8;
  undefined1 *local_14d0;
  undefined1 *local_14c8;
  undefined1 *local_14c0;
  undefined1 *local_14b8;
  undefined1 (*local_14b0) [32];
  undefined1 *local_14a8;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined4 uStack_1484;
  undefined1 local_1480 [32];
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined4 uStack_1444;
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  undefined4 uStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  ulong local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined1 local_f40 [8];
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  undefined4 uStack_ee4;
  float *local_ec8;
  undefined1 *local_ec0;
  float *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  float *local_ea0;
  undefined8 *local_e98;
  undefined1 *local_e90;
  float *local_e88;
  undefined8 *local_e80;
  undefined8 *local_e78;
  float *local_e70;
  undefined8 *local_e68;
  undefined1 *local_e60;
  float *local_e58;
  undefined8 *local_e50;
  undefined8 *local_e48;
  float *local_e40;
  undefined8 *local_e38;
  undefined1 *local_e30;
  ulong *local_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  ulong uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  ulong local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  undefined4 local_9a0;
  undefined4 local_99c;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 local_948;
  undefined4 local_944;
  undefined1 local_940 [16];
  undefined1 auStack_930 [16];
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined4 local_860;
  undefined4 local_85c;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined1 local_800 [16];
  undefined1 auStack_7f0 [16];
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined4 local_784;
  undefined1 local_780 [16];
  undefined1 auStack_770 [16];
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined1 local_730 [16];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined8 *local_458;
  undefined1 *local_450;
  undefined8 *local_448;
  float *local_440;
  undefined1 *local_438;
  float *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  float *local_418;
  undefined8 *local_410;
  undefined1 *local_408;
  float *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  float *local_3e8;
  undefined8 *local_3e0;
  undefined1 *local_3d8;
  float *local_3d0;
  undefined8 *local_3c8;
  undefined8 *local_3c0;
  float *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_34;
  
  local_15f0 = *(int *)((long)in_RDI + 0x2c);
  local_15f4 = (int)in_RDI[6];
  local_15f8 = *(int *)((long)in_RDI + 0x34);
  local_15fc = (int)in_RDI[7];
  local_1600 = (int)in_RDI[3];
  local_1604 = local_15f0 * local_15f4 * local_15f8 * local_1600;
  local_15e0 = in_RDI;
  for (local_1608 = 0; local_1608 < local_15fc; local_1608 = local_1608 + 1) {
    local_15c8 = &local_1658;
    local_151c = *(int *)((long)local_15e0 + 0x2c);
    local_1520 = (int)local_15e0[6];
    local_1524 = *(undefined4 *)((long)local_15e0 + 0x34);
    local_1530 = (undefined1 (*) [32])
                 (*local_15e0 + local_15e0[8] * (long)local_1608 * local_15e0[2]);
    local_1538 = local_15e0[2];
    local_153c = (undefined4)local_15e0[3];
    local_1548 = local_15e0[4];
    local_1518 = &local_1658;
    local_1508 = (long)local_151c * (long)local_1520 * local_1538;
    local_15c0 = &local_1658;
    local_15b0 = &local_1658;
    local_150c = 0x10;
    local_15d4 = local_1608;
    local_15d5 = 1;
    local_1658 = 0;
    local_1648 = 0;
    local_1640 = 0;
    local_1630 = 0;
    local_162c = 0;
    local_1628 = 0;
    local_1624 = 0;
    local_1620 = 0;
    local_1618 = 0;
    local_1650 = 0;
    local_1610 = local_1530;
    for (local_165c = 0; local_165c + 7 < local_1604; local_165c = local_165c + 8) {
      local_15a8 = local_1610;
      auVar10 = *local_1610;
      local_14c8 = local_15e9;
      local_14d0 = local_1680;
      local_1680._0_8_ = auVar10._0_8_;
      local_1120 = local_1680._0_8_;
      local_1680._8_8_ = auVar10._8_8_;
      uStack_1118 = local_1680._8_8_;
      local_1680._16_8_ = auVar10._16_8_;
      uStack_1110 = local_1680._16_8_;
      local_1680._24_8_ = auVar10._24_8_;
      uStack_1108 = local_1680._24_8_;
      local_a04 = 0x80000000;
      local_9e0 = 0x80000000;
      auVar1 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x20);
      local_a00 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x20);
      auStack_9f0 = vinsertps_avx(auVar1,ZEXT416(0x80000000),0x30);
      local_1140 = local_a00._0_8_;
      uStack_1138 = local_a00._8_8_;
      uStack_1130 = auStack_9f0._0_8_;
      uStack_1128 = auStack_9f0._8_8_;
      local_a08 = 0x3f000000;
      local_9a0 = 0x3f000000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      local_9c0 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      auStack_9b0 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      local_1160 = local_9c0._0_8_;
      uStack_1158 = local_9c0._8_8_;
      uStack_1150 = auStack_9b0._0_8_;
      uStack_1148 = auStack_9b0._8_8_;
      local_a0c = 0x3f800000;
      local_960 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_980 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_970 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_1180 = local_980._0_8_;
      uStack_1178 = local_980._8_8_;
      uStack_1170 = auStack_970._0_8_;
      uStack_1168 = auStack_970._8_8_;
      local_a10 = 0x3cc48f19;
      local_920 = 0x3cc48f19;
      auVar1 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3cc48f19),0x20);
      local_940 = vinsertps_avx(auVar1,ZEXT416(0x3cc48f19),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3cc48f19),0x20);
      auStack_930 = vinsertps_avx(auVar1,ZEXT416(0x3cc48f19),0x30);
      local_11a0 = local_940._0_8_;
      uStack_1198 = local_940._8_8_;
      uStack_1190 = auStack_930._0_8_;
      uStack_1188 = auStack_930._8_8_;
      local_a14 = 0x3d2dbdcf;
      local_8e0 = 0x3d2dbdcf;
      auVar1 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d2dbdcf),0x20);
      local_900 = vinsertps_avx(auVar1,ZEXT416(0x3d2dbdcf),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d2dbdcf),0x20);
      auStack_8f0 = vinsertps_avx(auVar1,ZEXT416(0x3d2dbdcf),0x30);
      local_11c0 = local_900._0_8_;
      uStack_11b8 = local_900._8_8_;
      uStack_11b0 = auStack_8f0._0_8_;
      uStack_11a8 = auStack_8f0._8_8_;
      local_a18 = 0x3d997dcc;
      local_8a0 = 0x3d997dcc;
      auVar1 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d997dcc),0x20);
      local_8c0 = vinsertps_avx(auVar1,ZEXT416(0x3d997dcc),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d997dcc),0x20);
      auStack_8b0 = vinsertps_avx(auVar1,ZEXT416(0x3d997dcc),0x30);
      local_11e0 = local_8c0._0_8_;
      uStack_11d8 = local_8c0._8_8_;
      uStack_11d0 = auStack_8b0._0_8_;
      uStack_11c8 = auStack_8b0._8_8_;
      local_a1c = 0x3d3a73d8;
      local_860 = 0x3d3a73d8;
      auVar1 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d3a73d8),0x20);
      local_880 = vinsertps_avx(auVar1,ZEXT416(0x3d3a73d8),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d3a73d8),0x20);
      auStack_870 = vinsertps_avx(auVar1,ZEXT416(0x3d3a73d8),0x30);
      local_1200 = local_880._0_8_;
      uStack_11f8 = local_880._8_8_;
      uStack_11f0 = auStack_870._0_8_;
      uStack_11e8 = auStack_870._8_8_;
      local_a20 = 0x3f800000;
      local_820 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_840 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_830 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_1220 = local_840._0_8_;
      uStack_1218 = local_840._8_8_;
      uStack_1210 = auStack_830._0_8_;
      uStack_1208 = auStack_830._8_8_;
      local_a24 = 0x3e2aaaf8;
      local_7e0 = 0x3e2aaaf8;
      auVar1 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3e2aaaf8),0x20);
      local_800 = vinsertps_avx(auVar1,ZEXT416(0x3e2aaaf8),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3e2aaaf8),0x20);
      auStack_7f0 = vinsertps_avx(auVar1,ZEXT416(0x3e2aaaf8),0x30);
      local_1240 = local_800._0_8_;
      uStack_1238 = local_800._8_8_;
      uStack_1230 = auStack_7f0._0_8_;
      uStack_1228 = auStack_7f0._8_8_;
      local_a28 = 0x3fc90fdb;
      local_7a0 = 0x3fc90fdb;
      auVar1 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3fc90fdb),0x20);
      local_7c0 = vinsertps_avx(auVar1,ZEXT416(0x3fc90fdb),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3fc90fdb),0x20);
      auStack_7b0 = vinsertps_avx(auVar1,ZEXT416(0x3fc90fdb),0x30);
      local_1260 = local_7c0._0_8_;
      uStack_1258 = local_7c0._8_8_;
      uStack_1250 = auStack_7b0._0_8_;
      uStack_1248 = auStack_7b0._8_8_;
      local_a2c = 0x40400000;
      local_760 = 0x40400000;
      auVar1 = vinsertps_avx(ZEXT416(0x40400000),ZEXT416(0x40400000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40400000),0x20);
      local_780 = vinsertps_avx(auVar1,ZEXT416(0x40400000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x40400000),ZEXT416(0x40400000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40400000),0x20);
      auStack_770 = vinsertps_avx(auVar1,ZEXT416(0x40400000),0x30);
      local_1280 = local_780._0_8_;
      uStack_1278 = local_780._8_8_;
      uStack_1270 = auStack_770._0_8_;
      uStack_1268 = auStack_770._8_8_;
      local_10a0 = local_a00._0_8_;
      uStack_1098 = local_a00._8_8_;
      uStack_1090 = auStack_9f0._0_8_;
      uStack_1088 = auStack_9f0._8_8_;
      auVar11._16_8_ = auStack_9f0._0_8_;
      auVar11._0_16_ = local_a00;
      auVar11._24_8_ = auStack_9f0._8_8_;
      local_12a0 = vandps_avx(auVar11,auVar10);
      local_a60 = local_a00._0_8_;
      uStack_a58 = local_a00._8_8_;
      uStack_a50 = auStack_9f0._0_8_;
      uStack_a48 = auStack_9f0._8_8_;
      auVar15._16_8_ = auStack_9f0._0_8_;
      auVar15._0_16_ = local_a00;
      auVar15._24_8_ = auStack_9f0._8_8_;
      local_12c0 = vandnps_avx(auVar15,auVar10);
      auVar10._16_8_ = auStack_9b0._0_8_;
      auVar10._0_16_ = local_9c0;
      auVar10._24_8_ = auStack_9b0._8_8_;
      local_12e0 = vcmpps_avx(local_12c0,auVar10,2);
      local_aa0 = local_12e0._0_8_;
      uStack_a98 = local_12e0._8_8_;
      uStack_a90 = local_12e0._16_8_;
      uStack_a88 = local_12e0._24_8_;
      local_ac0 = local_980._0_8_;
      uStack_ab8 = local_980._8_8_;
      uStack_ab0 = auStack_970._0_8_;
      uStack_aa8 = auStack_970._8_8_;
      auVar14._16_8_ = auStack_970._0_8_;
      auVar14._0_16_ = local_980;
      auVar14._24_8_ = auStack_970._8_8_;
      local_1300 = vandnps_avx(local_12e0,auVar14);
      local_1060 = local_980._0_8_;
      uStack_1058 = local_980._8_8_;
      uStack_1050 = auStack_970._0_8_;
      uStack_1048 = auStack_970._8_8_;
      local_1080 = local_12c0._0_8_;
      uStack_1078 = local_12c0._8_8_;
      uStack_1070 = local_12c0._16_8_;
      uStack_1068 = local_12c0._24_8_;
      auVar12._16_8_ = auStack_970._0_8_;
      auVar12._0_16_ = local_980;
      auVar12._24_8_ = auStack_970._8_8_;
      _local_f40 = vsubps_avx(auVar12,local_12c0);
      local_f20._0_4_ = local_9c0._0_4_;
      local_f20._4_4_ = local_9c0._4_4_;
      uStack_f18._0_4_ = local_9c0._8_4_;
      uStack_f18._4_4_ = local_9c0._12_4_;
      uStack_f10._0_4_ = auStack_9b0._0_4_;
      uStack_f10._4_4_ = auStack_9b0._4_4_;
      uStack_f08._0_4_ = auStack_9b0._8_4_;
      uStack_f08._4_4_ = auStack_9b0._12_4_;
      uStack_ee4 = uStack_f08._4_4_;
      local_f00 = (float)local_f20 * (float)local_f40._0_4_;
      fStack_efc = local_f20._4_4_ * (float)local_f40._4_4_;
      fStack_ef8 = (float)uStack_f18 * fStack_f38;
      fStack_ef4 = uStack_f18._4_4_ * fStack_f34;
      fStack_ef0 = (float)uStack_f10 * fStack_f30;
      fStack_eec = uStack_f10._4_4_ * fStack_f2c;
      fStack_ee8 = (float)uStack_f08 * fStack_f28;
      auVar13._4_4_ = fStack_efc;
      auVar13._0_4_ = local_f00;
      auVar13._8_4_ = fStack_ef8;
      auVar13._12_4_ = fStack_ef4;
      auVar13._16_4_ = fStack_ef0;
      auVar13._20_4_ = fStack_eec;
      auVar13._24_4_ = fStack_ee8;
      auVar13._28_4_ = uStack_f08._4_4_;
      local_1320 = vsqrtps_avx(auVar13);
      local_10e0 = local_12e0._0_8_;
      uStack_10d8 = local_12e0._8_8_;
      uStack_10d0 = local_12e0._16_8_;
      uStack_10c8 = local_12e0._24_8_;
      local_1100 = local_12c0._0_8_;
      uStack_10f8 = local_12c0._8_8_;
      uStack_10f0 = local_12c0._16_8_;
      uStack_10e8 = local_12c0._24_8_;
      local_b20 = vandps_avx(local_12e0,local_12c0);
      local_ae0 = local_12e0._0_8_;
      uStack_ad8 = local_12e0._8_8_;
      uStack_ad0 = local_12e0._16_8_;
      uStack_ac8 = local_12e0._24_8_;
      local_b00 = local_1320._0_8_;
      uStack_af8 = local_1320._8_8_;
      uStack_af0 = local_1320._16_8_;
      uStack_ae8 = local_1320._24_8_;
      local_b40 = vandnps_avx(local_12e0,local_1320);
      local_1340 = vorps_avx(local_b20,local_b40);
      local_f80 = local_1340._0_8_;
      uStack_f78 = local_1340._8_8_;
      uStack_f70 = local_1340._16_8_;
      uStack_f68 = local_1340._24_8_;
      local_f60._0_4_ = local_1340._0_4_;
      local_f60._4_4_ = local_1340._4_4_;
      uStack_f58._0_4_ = local_1340._8_4_;
      uStack_f58._4_4_ = local_1340._12_4_;
      uStack_f50._0_4_ = local_1340._16_4_;
      uStack_f50._4_4_ = local_1340._20_4_;
      uStack_f48._0_4_ = local_1340._24_4_;
      uStack_f48._4_4_ = local_1340._28_4_;
      uStack_1344 = uStack_f48._4_4_;
      local_1360 = (float)local_f60 * (float)local_f60;
      fStack_135c = local_f60._4_4_ * local_f60._4_4_;
      fStack_1358 = (float)uStack_f58 * (float)uStack_f58;
      fStack_1354 = uStack_f58._4_4_ * uStack_f58._4_4_;
      fStack_1350 = (float)uStack_f50 * (float)uStack_f50;
      fStack_134c = uStack_f50._4_4_ * uStack_f50._4_4_;
      fStack_1348 = (float)uStack_f48 * (float)uStack_f48;
      local_fc0 = CONCAT44(fStack_135c,local_1360);
      uStack_fb8 = CONCAT44(fStack_1354,fStack_1358);
      uStack_fb0 = CONCAT44(fStack_134c,fStack_1350);
      uStack_fa8 = CONCAT44(uStack_f48._4_4_,fStack_1348);
      uStack_1364 = uStack_f48._4_4_;
      local_1380 = local_1360 * local_1360;
      fStack_137c = fStack_135c * fStack_135c;
      fStack_1378 = fStack_1358 * fStack_1358;
      fStack_1374 = fStack_1354 * fStack_1354;
      fStack_1370 = fStack_1350 * fStack_1350;
      fStack_136c = fStack_134c * fStack_134c;
      fStack_1368 = fStack_1348 * fStack_1348;
      local_e88 = &local_1380;
      local_e48 = &local_11c0;
      local_e50 = &local_1200;
      local_de0 = CONCAT44(fStack_137c,local_1380);
      uStack_dd8 = CONCAT44(fStack_1374,fStack_1378);
      uStack_dd0 = CONCAT44(fStack_136c,fStack_1370);
      uStack_dc8 = CONCAT44(uStack_f48._4_4_,fStack_1368);
      auVar18._4_4_ = fStack_137c;
      auVar18._0_4_ = local_1380;
      auVar18._8_4_ = fStack_1378;
      auVar18._12_4_ = fStack_1374;
      auVar18._16_4_ = fStack_1370;
      auVar18._20_4_ = fStack_136c;
      auVar18._24_4_ = fStack_1368;
      auVar18._28_4_ = uStack_f48._4_4_;
      local_e00 = local_900._0_8_;
      uStack_df8 = local_900._8_8_;
      uStack_df0 = auStack_8f0._0_8_;
      uStack_de8 = auStack_8f0._8_8_;
      auVar27._16_8_ = auStack_8f0._0_8_;
      auVar27._0_16_ = local_900;
      auVar27._24_8_ = auStack_8f0._8_8_;
      local_e20 = local_880._0_8_;
      uStack_e18 = local_880._8_8_;
      uStack_e10 = auStack_870._0_8_;
      uStack_e08 = auStack_870._8_8_;
      auVar25._16_8_ = auStack_870._0_8_;
      auVar25._0_16_ = local_880;
      auVar25._24_8_ = auStack_870._8_8_;
      auVar1 = vfmadd213ps_fma(auVar27,auVar18,auVar25);
      local_e60 = local_13e0;
      local_e68 = &local_1240;
      local_d80 = CONCAT44(fStack_137c,local_1380);
      uStack_d78 = CONCAT44(fStack_1374,fStack_1378);
      uStack_d70 = CONCAT44(fStack_136c,fStack_1370);
      uStack_d68 = CONCAT44(uStack_f48._4_4_,fStack_1368);
      auVar19._4_4_ = fStack_137c;
      auVar19._0_4_ = local_1380;
      auVar19._8_4_ = fStack_1378;
      auVar19._12_4_ = fStack_1374;
      auVar19._16_4_ = fStack_1370;
      auVar19._20_4_ = fStack_136c;
      auVar19._24_4_ = fStack_1368;
      auVar19._28_4_ = uStack_f48._4_4_;
      local_13e0._0_8_ = auVar1._0_8_;
      local_da0 = local_13e0._0_8_;
      local_13e0._8_8_ = auVar1._8_8_;
      uStack_d98 = local_13e0._8_8_;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = local_800._0_8_;
      uStack_db8 = local_800._8_8_;
      uStack_db0 = auStack_7f0._0_8_;
      uStack_da8 = auStack_7f0._8_8_;
      auVar23._16_8_ = auStack_7f0._0_8_;
      auVar23._0_16_ = local_800;
      auVar23._24_8_ = auStack_7f0._8_8_;
      auVar2 = vfmadd213ps_fma(ZEXT1632(auVar1),auVar19,auVar23);
      local_e78 = &local_11a0;
      local_e80 = &local_11e0;
      local_d20 = CONCAT44(fStack_137c,local_1380);
      uStack_d18 = CONCAT44(fStack_1374,fStack_1378);
      uStack_d10 = CONCAT44(fStack_136c,fStack_1370);
      uStack_d08 = CONCAT44(uStack_f48._4_4_,fStack_1368);
      auVar20._4_4_ = fStack_137c;
      auVar20._0_4_ = local_1380;
      auVar20._8_4_ = fStack_1378;
      auVar20._12_4_ = fStack_1374;
      auVar20._16_4_ = fStack_1370;
      auVar20._20_4_ = fStack_136c;
      auVar20._24_4_ = fStack_1368;
      auVar20._28_4_ = uStack_f48._4_4_;
      local_d40 = local_940._0_8_;
      uStack_d38 = local_940._8_8_;
      uStack_d30 = auStack_930._0_8_;
      uStack_d28 = auStack_930._8_8_;
      auVar28._16_8_ = auStack_930._0_8_;
      auVar28._0_16_ = local_940;
      auVar28._24_8_ = auStack_930._8_8_;
      local_d60 = local_8c0._0_8_;
      uStack_d58 = local_8c0._8_8_;
      uStack_d50 = auStack_8b0._0_8_;
      uStack_d48 = auStack_8b0._8_8_;
      auVar26._16_8_ = auStack_8b0._0_8_;
      auVar26._0_16_ = local_8c0;
      auVar26._24_8_ = auStack_8b0._8_8_;
      auVar3 = vfmadd213ps_fma(auVar28,auVar20,auVar26);
      local_e90 = local_1420;
      local_e98 = &local_1220;
      local_cc0 = CONCAT44(fStack_137c,local_1380);
      uStack_cb8 = CONCAT44(fStack_1374,fStack_1378);
      uStack_cb0 = CONCAT44(fStack_136c,fStack_1370);
      uStack_ca8 = CONCAT44(uStack_f48._4_4_,fStack_1368);
      auVar21._4_4_ = fStack_137c;
      auVar21._0_4_ = local_1380;
      auVar21._8_4_ = fStack_1378;
      auVar21._12_4_ = fStack_1374;
      auVar21._16_4_ = fStack_1370;
      auVar21._20_4_ = fStack_136c;
      auVar21._24_4_ = fStack_1368;
      auVar21._28_4_ = uStack_f48._4_4_;
      local_1420._0_8_ = auVar3._0_8_;
      local_ce0 = local_1420._0_8_;
      local_1420._8_8_ = auVar3._8_8_;
      uStack_cd8 = local_1420._8_8_;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_840._0_8_;
      uStack_cf8 = local_840._8_8_;
      uStack_cf0 = auStack_830._0_8_;
      uStack_ce8 = auStack_830._8_8_;
      auVar24._16_8_ = auStack_830._0_8_;
      auVar24._0_16_ = local_840;
      auVar24._24_8_ = auStack_830._8_8_;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar21,auVar24);
      local_ea0 = &local_1360;
      local_ea8 = local_13c0;
      local_eb0 = local_1400;
      local_c60 = CONCAT44(fStack_135c,local_1360);
      uStack_c58 = CONCAT44(fStack_1354,fStack_1358);
      uStack_c50 = CONCAT44(fStack_134c,fStack_1350);
      uStack_c48 = CONCAT44(uStack_f48._4_4_,fStack_1348);
      auVar22._4_4_ = fStack_135c;
      auVar22._0_4_ = local_1360;
      auVar22._8_4_ = fStack_1358;
      auVar22._12_4_ = fStack_1354;
      auVar22._16_4_ = fStack_1350;
      auVar22._20_4_ = fStack_134c;
      auVar22._24_4_ = fStack_1348;
      auVar22._28_4_ = uStack_f48._4_4_;
      local_13c0._0_8_ = auVar2._0_8_;
      local_c80 = local_13c0._0_8_;
      local_13c0._8_8_ = auVar2._8_8_;
      uStack_c78 = local_13c0._8_8_;
      uStack_c70 = 0;
      uStack_c68 = 0;
      local_1400._0_8_ = auVar4._0_8_;
      local_ca0 = local_1400._0_8_;
      local_1400._8_8_ = auVar4._8_8_;
      uStack_c98 = local_1400._8_8_;
      uStack_c90 = 0;
      uStack_c88 = 0;
      auVar5 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar22,ZEXT1632(auVar4));
      local_13a0._0_8_ = auVar5._0_8_;
      uVar8 = local_13a0._0_8_;
      local_13a0._8_8_ = auVar5._8_8_;
      uVar9 = local_13a0._8_8_;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      local_1000 = local_1340._0_8_;
      uStack_ff8 = local_1340._8_8_;
      uStack_ff0 = local_1340._16_8_;
      uStack_fe8 = local_1340._24_8_;
      local_fe0._0_4_ = auVar5._0_4_;
      local_fe0._4_4_ = auVar5._4_4_;
      uStack_fd8._0_4_ = auVar5._8_4_;
      uStack_fd8._4_4_ = auVar5._12_4_;
      uStack_1444 = 0;
      local_1460 = (float)local_fe0 * (float)local_f60;
      fStack_145c = local_fe0._4_4_ * local_f60._4_4_;
      fStack_1458 = (float)uStack_fd8 * (float)uStack_f58;
      fStack_1454 = uStack_fd8._4_4_ * uStack_f58._4_4_;
      fStack_1450 = (float)uStack_f50 * 0.0;
      fStack_144c = uStack_f50._4_4_ * 0.0;
      fStack_1448 = (float)uStack_f48 * 0.0;
      local_e28 = &local_1280;
      local_e30 = local_1300;
      local_e38 = &local_1180;
      local_ba0 = local_780._0_8_;
      local_bc0 = local_1300._0_8_;
      uStack_bb8 = local_1300._8_8_;
      uStack_bb0 = local_1300._16_8_;
      uStack_ba8 = local_1300._24_8_;
      local_be0 = local_980._0_8_;
      uStack_bd8 = local_980._8_8_;
      uStack_bd0 = auStack_970._0_8_;
      uStack_bc8 = auStack_970._8_8_;
      auVar29._16_8_ = auStack_970._0_8_;
      auVar29._0_16_ = local_980;
      auVar29._24_8_ = auStack_970._8_8_;
      uStack_b98._0_4_ = local_780._8_4_;
      uStack_b98._4_4_ = local_780._12_4_;
      uStack_b90._0_4_ = auStack_770._0_4_;
      uStack_b90._4_4_ = auStack_770._4_4_;
      uStack_b88._0_4_ = auStack_770._8_4_;
      uStack_b88._4_4_ = auStack_770._12_4_;
      auVar45._0_8_ = local_780._0_8_ ^ 0x8000000080000000;
      auVar45._8_4_ = (uint)uStack_b98 ^ 0x80000000;
      auVar45._12_4_ = uStack_b98._4_4_ ^ 0x80000000;
      auVar45._16_4_ = (uint)uStack_b90 ^ 0x80000000;
      auVar45._20_4_ = uStack_b90._4_4_ ^ 0x80000000;
      auVar45._24_4_ = (uint)uStack_b88 ^ 0x80000000;
      auVar45._28_4_ = uStack_b88._4_4_ ^ 0x80000000;
      auVar6 = vfmadd213ps_fma(local_1300,auVar45,auVar29);
      local_1020._0_4_ = local_7c0._0_4_;
      local_1020._4_4_ = local_7c0._4_4_;
      uStack_1018._0_4_ = local_7c0._8_4_;
      uStack_1018._4_4_ = local_7c0._12_4_;
      uStack_1010._0_4_ = auStack_7b0._0_4_;
      uStack_1010._4_4_ = auStack_7b0._4_4_;
      uStack_1008._0_4_ = auStack_7b0._8_4_;
      uStack_1008._4_4_ = auStack_7b0._12_4_;
      uStack_1484 = uStack_1008._4_4_;
      local_1040._0_4_ = local_1300._0_4_;
      local_1040._4_4_ = local_1300._4_4_;
      uStack_1038._0_4_ = local_1300._8_4_;
      uStack_1038._4_4_ = local_1300._12_4_;
      uStack_1030._0_4_ = local_1300._16_4_;
      uStack_1030._4_4_ = local_1300._20_4_;
      uStack_1028._0_4_ = local_1300._24_4_;
      local_14a0 = (float)local_1020 * (float)local_1040;
      fStack_149c = local_1020._4_4_ * local_1040._4_4_;
      fStack_1498 = (float)uStack_1018 * (float)uStack_1038;
      fStack_1494 = uStack_1018._4_4_ * uStack_1038._4_4_;
      fStack_1490 = (float)uStack_1010 * (float)uStack_1030;
      fStack_148c = uStack_1010._4_4_ * uStack_1030._4_4_;
      fStack_1488 = (float)uStack_1008 * (float)uStack_1028;
      local_eb8 = &local_1460;
      local_ec0 = local_1480;
      local_ec8 = &local_14a0;
      local_c00 = CONCAT44(fStack_145c,local_1460);
      uStack_bf8 = CONCAT44(fStack_1454,fStack_1458);
      uStack_bf0 = CONCAT44(fStack_144c,fStack_1450);
      uStack_be8 = (ulong)(uint)fStack_1448;
      auVar17._4_4_ = fStack_145c;
      auVar17._0_4_ = local_1460;
      auVar17._8_4_ = fStack_1458;
      auVar17._12_4_ = fStack_1454;
      auVar17._16_4_ = fStack_1450;
      auVar17._20_4_ = fStack_144c;
      auVar17._24_4_ = fStack_1448;
      auVar17._28_4_ = 0;
      local_1480._0_8_ = auVar6._0_8_;
      local_c20 = local_1480._0_8_;
      local_1480._8_8_ = auVar6._8_8_;
      uStack_c18 = local_1480._8_8_;
      uStack_c10 = 0;
      uStack_c08 = 0;
      local_c40 = CONCAT44(fStack_149c,local_14a0);
      uStack_c38 = CONCAT44(fStack_1494,fStack_1498);
      uStack_c30 = CONCAT44(fStack_148c,fStack_1490);
      uStack_c28 = CONCAT44(uStack_1008._4_4_,fStack_1488);
      auVar16._4_4_ = fStack_149c;
      auVar16._0_4_ = local_14a0;
      auVar16._8_4_ = fStack_1498;
      auVar16._12_4_ = fStack_1494;
      auVar16._16_4_ = fStack_1490;
      auVar16._20_4_ = fStack_148c;
      auVar16._24_4_ = fStack_1488;
      auVar16._28_4_ = uStack_1008._4_4_;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar17,auVar16);
      local_1440._0_8_ = auVar7._0_8_;
      local_b60 = local_1440._0_8_;
      local_1440._8_8_ = auVar7._8_8_;
      uStack_b58 = local_1440._8_8_;
      uStack_b50 = 0;
      uStack_b48 = 0;
      local_b80 = local_12a0._0_8_;
      uStack_b78 = local_12a0._8_8_;
      uStack_b70 = local_12a0._16_8_;
      uStack_b68 = local_12a0._24_8_;
      local_1680 = vorps_avx(ZEXT1632(auVar7),local_12a0);
      local_1570 = local_1610;
      local_15a0 = local_1680._0_8_;
      uStack_1598 = local_1680._8_8_;
      uStack_1590 = local_1680._16_8_;
      uStack_1588 = local_1680._24_8_;
      *local_1610 = local_1680;
      local_1610 = local_1610 + 1;
      local_1480 = ZEXT1632(auVar6);
      local_1440 = ZEXT1632(auVar7);
      local_1420 = ZEXT1632(auVar3);
      local_1400 = ZEXT1632(auVar4);
      local_13e0 = ZEXT1632(auVar1);
      local_13c0 = ZEXT1632(auVar2);
      local_13a0 = ZEXT1632(auVar5);
      local_10c0 = local_1120;
      uStack_10b8 = uStack_1118;
      uStack_10b0 = uStack_1110;
      uStack_10a8 = uStack_1108;
      local_1040 = local_1300._0_8_;
      uStack_1038 = local_1300._8_8_;
      uStack_1030 = local_1300._16_8_;
      uStack_1028 = local_1300._24_8_;
      local_1020 = local_7c0._0_8_;
      uStack_1018 = local_7c0._8_8_;
      uStack_1010 = auStack_7b0._0_8_;
      uStack_1008 = auStack_7b0._8_8_;
      local_fe0 = uVar8;
      uStack_fd8 = uVar9;
      local_fa0 = local_fc0;
      uStack_f98 = uStack_fb8;
      uStack_f90 = uStack_fb0;
      uStack_f88 = uStack_fa8;
      local_f60 = local_f80;
      uStack_f58 = uStack_f78;
      uStack_f50 = uStack_f70;
      uStack_f48 = uStack_f68;
      local_f20 = local_9c0._0_8_;
      uStack_f18 = local_9c0._8_8_;
      uStack_f10 = auStack_9b0._0_8_;
      uStack_f08 = auStack_9b0._8_8_;
      local_e70 = local_e88;
      local_e58 = local_e88;
      local_e40 = local_e88;
      uStack_b98 = local_780._8_8_;
      uStack_b90 = auStack_770._0_8_;
      uStack_b88 = auStack_770._8_8_;
      local_a80 = local_1120;
      uStack_a78 = uStack_1118;
      uStack_a70 = uStack_1110;
      uStack_a68 = uStack_1108;
      local_9dc = local_9e0;
      local_9d8 = local_9e0;
      local_9d4 = local_9e0;
      local_9d0 = local_9e0;
      local_9cc = local_9e0;
      local_9c8 = local_9e0;
      local_9c4 = local_9e0;
      local_99c = local_9a0;
      local_998 = local_9a0;
      local_994 = local_9a0;
      local_990 = local_9a0;
      local_98c = local_9a0;
      local_988 = local_9a0;
      local_984 = local_9a0;
      local_95c = local_960;
      local_958 = local_960;
      local_954 = local_960;
      local_950 = local_960;
      local_94c = local_960;
      local_948 = local_960;
      local_944 = local_960;
      local_91c = local_920;
      local_918 = local_920;
      local_914 = local_920;
      local_910 = local_920;
      local_90c = local_920;
      local_908 = local_920;
      local_904 = local_920;
      local_8dc = local_8e0;
      local_8d8 = local_8e0;
      local_8d4 = local_8e0;
      local_8d0 = local_8e0;
      local_8cc = local_8e0;
      local_8c8 = local_8e0;
      local_8c4 = local_8e0;
      local_89c = local_8a0;
      local_898 = local_8a0;
      local_894 = local_8a0;
      local_890 = local_8a0;
      local_88c = local_8a0;
      local_888 = local_8a0;
      local_884 = local_8a0;
      local_85c = local_860;
      local_858 = local_860;
      local_854 = local_860;
      local_850 = local_860;
      local_84c = local_860;
      local_848 = local_860;
      local_844 = local_860;
      local_81c = local_820;
      local_818 = local_820;
      local_814 = local_820;
      local_810 = local_820;
      local_80c = local_820;
      local_808 = local_820;
      local_804 = local_820;
      local_7dc = local_7e0;
      local_7d8 = local_7e0;
      local_7d4 = local_7e0;
      local_7d0 = local_7e0;
      local_7cc = local_7e0;
      local_7c8 = local_7e0;
      local_7c4 = local_7e0;
      local_79c = local_7a0;
      local_798 = local_7a0;
      local_794 = local_7a0;
      local_790 = local_7a0;
      local_78c = local_7a0;
      local_788 = local_7a0;
      local_784 = local_7a0;
      local_75c = local_760;
      local_758 = local_760;
      local_754 = local_760;
      local_750 = local_760;
      local_74c = local_760;
      local_748 = local_760;
      local_744 = local_760;
    }
    for (; local_14f8 = local_15b0, local_1638 = local_1548, local_165c + 3 < local_1604;
        local_165c = local_165c + 4) {
      local_1568 = local_1610;
      auVar2 = *(undefined1 (*) [16])*local_1610;
      local_14b8 = local_15e9;
      local_14c0 = local_1690;
      local_1690._0_8_ = auVar2._0_8_;
      local_580 = local_1690._0_8_;
      local_1690._8_8_ = auVar2._8_8_;
      uStack_578 = local_1690._8_8_;
      local_54 = 0x80000000;
      local_34 = 0x80000000;
      local_50 = 0x80000000;
      local_590 = 0x8000000080000000;
      uStack_588 = 0x8000000080000000;
      local_74 = 0x3f000000;
      local_58 = 0x3f000000;
      local_70 = 0x3f000000;
      local_5a0 = 0x3f0000003f000000;
      uStack_598 = 0x3f0000003f000000;
      local_94 = 0x3f800000;
      local_78 = 0x3f800000;
      local_90 = 0x3f800000;
      local_5b0 = 0x3f8000003f800000;
      uStack_5a8 = 0x3f8000003f800000;
      local_b4 = 0x3cc48f19;
      local_98 = 0x3cc48f19;
      local_b0 = 0x3cc48f19;
      local_5c0 = 0x3cc48f193cc48f19;
      uStack_5b8 = 0x3cc48f193cc48f19;
      local_d4 = 0x3d2dbdcf;
      local_b8 = 0x3d2dbdcf;
      local_d0 = 0x3d2dbdcf;
      local_5d0 = 0x3d2dbdcf3d2dbdcf;
      uStack_5c8 = 0x3d2dbdcf3d2dbdcf;
      local_f4 = 0x3d997dcc;
      local_d8 = 0x3d997dcc;
      local_f0 = 0x3d997dcc;
      local_5e0 = 0x3d997dcc3d997dcc;
      uStack_5d8 = 0x3d997dcc3d997dcc;
      local_114 = 0x3d3a73d8;
      local_f8 = 0x3d3a73d8;
      local_110 = 0x3d3a73d8;
      local_5f0 = 0x3d3a73d83d3a73d8;
      uStack_5e8 = 0x3d3a73d83d3a73d8;
      local_134 = 0x3f800000;
      local_118 = 0x3f800000;
      local_130 = 0x3f800000;
      local_600 = 0x3f8000003f800000;
      uStack_5f8 = 0x3f8000003f800000;
      local_154 = 0x3e2aaaf8;
      local_138 = 0x3e2aaaf8;
      local_150 = 0x3e2aaaf8;
      local_610 = 0x3e2aaaf83e2aaaf8;
      uStack_608 = 0x3e2aaaf83e2aaaf8;
      local_174 = 0x3fc90fdb;
      local_158 = 0x3fc90fdb;
      local_170 = 0x3fc90fdb;
      local_620 = 0x3fc90fdb3fc90fdb;
      uStack_618 = 0x3fc90fdb3fc90fdb;
      local_194 = 0x40400000;
      local_178 = 0x40400000;
      local_190 = 0x40400000;
      local_630 = 0x4040000040400000;
      uStack_628 = 0x4040000040400000;
      auVar1._8_8_ = 0x8000000080000000;
      auVar1._0_8_ = 0x8000000080000000;
      local_640 = vpand_avx(auVar1,auVar2);
      auVar6._8_8_ = 0x8000000080000000;
      auVar6._0_8_ = 0x8000000080000000;
      local_650 = vpandn_avx(auVar6,auVar2);
      local_250 = local_650._0_8_;
      uStack_248 = local_650._8_8_;
      auVar4._8_8_ = 0x3f0000003f000000;
      auVar4._0_8_ = 0x3f0000003f000000;
      local_660 = vcmpps_avx(local_650,auVar4,2);
      local_1d0 = local_660._0_8_;
      uStack_1c8 = local_660._8_8_;
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      local_670 = vpandn_avx(local_660,auVar5);
      local_530 = local_650._0_8_;
      uStack_528 = local_650._8_8_;
      auVar2._8_8_ = 0x3f8000003f800000;
      auVar2._0_8_ = 0x3f8000003f800000;
      _local_490 = vsubps_avx(auVar2,local_650);
      local_470 = (float)local_490._0_4_ * 0.5;
      fStack_46c = (float)local_490._4_4_ * 0.5;
      fStack_468 = fStack_488 * 0.5;
      fStack_464 = fStack_484 * 0.5;
      auVar3._4_4_ = fStack_46c;
      auVar3._0_4_ = local_470;
      auVar3._8_4_ = fStack_468;
      auVar3._12_4_ = fStack_464;
      local_680 = vsqrtps_avx(auVar3);
      local_560 = local_660._0_8_;
      uStack_558 = local_660._8_8_;
      local_570 = local_650._0_8_;
      uStack_568 = local_650._8_8_;
      local_210 = vpand_avx(local_660,local_650);
      local_1f0 = local_660._0_8_;
      uStack_1e8 = local_660._8_8_;
      local_200 = local_680._0_8_;
      uStack_1f8 = local_680._8_8_;
      local_220 = vpandn_avx(local_660,local_680);
      local_690 = vpor_avx(local_210,local_220);
      local_4b0 = local_690._0_8_;
      uStack_4a8 = local_690._8_8_;
      local_4a0._0_4_ = local_690._0_4_;
      local_4a0._4_4_ = local_690._4_4_;
      uStack_498._0_4_ = local_690._8_4_;
      uStack_498._4_4_ = local_690._12_4_;
      local_6a0 = (float)local_4a0 * (float)local_4a0;
      fStack_69c = local_4a0._4_4_ * local_4a0._4_4_;
      fStack_698 = (float)uStack_498 * (float)uStack_498;
      fStack_694 = uStack_498._4_4_ * uStack_498._4_4_;
      local_4d0 = CONCAT44(fStack_69c,local_6a0);
      uStack_4c8 = CONCAT44(fStack_694,fStack_698);
      local_6b0 = local_6a0 * local_6a0;
      fStack_6ac = fStack_69c * fStack_69c;
      fStack_6a8 = fStack_698 * fStack_698;
      fStack_6a4 = fStack_694 * fStack_694;
      local_400 = &local_6b0;
      local_3c0 = &local_5d0;
      local_3c8 = &local_5f0;
      local_360 = CONCAT44(fStack_6ac,local_6b0);
      uStack_358 = CONCAT44(fStack_6a4,fStack_6a8);
      auVar31._4_4_ = fStack_6ac;
      auVar31._0_4_ = local_6b0;
      auVar31._8_4_ = fStack_6a8;
      auVar31._12_4_ = fStack_6a4;
      local_370 = 0x3d2dbdcf3d2dbdcf;
      uStack_368 = 0x3d2dbdcf3d2dbdcf;
      auVar41._8_8_ = 0x3d2dbdcf3d2dbdcf;
      auVar41._0_8_ = 0x3d2dbdcf3d2dbdcf;
      local_380 = 0x3d3a73d83d3a73d8;
      uStack_378 = 0x3d3a73d83d3a73d8;
      auVar39._8_8_ = 0x3d3a73d83d3a73d8;
      auVar39._0_8_ = 0x3d3a73d83d3a73d8;
      local_6e0 = vfmadd213ps_fma(auVar41,auVar31,auVar39);
      local_3d8 = local_6e0;
      local_3e0 = &local_610;
      local_330 = CONCAT44(fStack_6ac,local_6b0);
      uStack_328 = CONCAT44(fStack_6a4,fStack_6a8);
      auVar32._4_4_ = fStack_6ac;
      auVar32._0_4_ = local_6b0;
      auVar32._8_4_ = fStack_6a8;
      auVar32._12_4_ = fStack_6a4;
      local_340 = local_6e0._0_8_;
      uStack_338 = local_6e0._8_8_;
      local_350 = 0x3e2aaaf83e2aaaf8;
      uStack_348 = 0x3e2aaaf83e2aaaf8;
      auVar37._8_8_ = 0x3e2aaaf83e2aaaf8;
      auVar37._0_8_ = 0x3e2aaaf83e2aaaf8;
      local_6d0 = vfmadd213ps_fma(local_6e0,auVar32,auVar37);
      local_3f0 = &local_5c0;
      local_3f8 = &local_5e0;
      local_300 = CONCAT44(fStack_6ac,local_6b0);
      uStack_2f8 = CONCAT44(fStack_6a4,fStack_6a8);
      auVar33._4_4_ = fStack_6ac;
      auVar33._0_4_ = local_6b0;
      auVar33._8_4_ = fStack_6a8;
      auVar33._12_4_ = fStack_6a4;
      local_310 = 0x3cc48f193cc48f19;
      uStack_308 = 0x3cc48f193cc48f19;
      auVar42._8_8_ = 0x3cc48f193cc48f19;
      auVar42._0_8_ = 0x3cc48f193cc48f19;
      local_320 = 0x3d997dcc3d997dcc;
      uStack_318 = 0x3d997dcc3d997dcc;
      auVar40._8_8_ = 0x3d997dcc3d997dcc;
      auVar40._0_8_ = 0x3d997dcc3d997dcc;
      local_700 = vfmadd213ps_fma(auVar42,auVar33,auVar40);
      local_408 = local_700;
      local_410 = &local_600;
      local_2d0 = CONCAT44(fStack_6ac,local_6b0);
      uStack_2c8 = CONCAT44(fStack_6a4,fStack_6a8);
      auVar34._4_4_ = fStack_6ac;
      auVar34._0_4_ = local_6b0;
      auVar34._8_4_ = fStack_6a8;
      auVar34._12_4_ = fStack_6a4;
      local_2e0 = local_700._0_8_;
      uStack_2d8 = local_700._8_8_;
      local_2f0 = 0x3f8000003f800000;
      uStack_2e8 = 0x3f8000003f800000;
      auVar38._8_8_ = 0x3f8000003f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      local_6f0 = vfmadd213ps_fma(local_700,auVar34,auVar38);
      local_418 = &local_6a0;
      local_420 = local_6d0;
      local_428 = local_6f0;
      local_2a0 = CONCAT44(fStack_69c,local_6a0);
      uStack_298 = CONCAT44(fStack_694,fStack_698);
      auVar35._4_4_ = fStack_69c;
      auVar35._0_4_ = local_6a0;
      auVar35._8_4_ = fStack_698;
      auVar35._12_4_ = fStack_694;
      local_2b0 = local_6d0._0_8_;
      uStack_2a8 = local_6d0._8_8_;
      local_2c0 = local_6f0._0_8_;
      uStack_2b8 = local_6f0._8_8_;
      local_6c0 = vfmadd213ps_fma(local_6d0,auVar35,local_6f0);
      local_4f0 = local_690._0_8_;
      uStack_4e8 = local_690._8_8_;
      local_4e0._0_4_ = local_6c0._0_4_;
      local_4e0._4_4_ = local_6c0._4_4_;
      uStack_4d8._0_4_ = local_6c0._8_4_;
      uStack_4d8._4_4_ = local_6c0._12_4_;
      local_720 = (float)local_4e0 * (float)local_4a0;
      fStack_71c = local_4e0._4_4_ * local_4a0._4_4_;
      fStack_718 = (float)uStack_4d8 * (float)uStack_498;
      fStack_714 = uStack_4d8._4_4_ * uStack_498._4_4_;
      local_448 = &local_630;
      local_450 = local_670;
      local_458 = &local_5b0;
      local_390 = 0x4040000040400000;
      uStack_388 = 0x4040000040400000;
      auVar36._8_8_ = 0x4040000040400000;
      auVar36._0_8_ = 0x4040000040400000;
      local_3a0 = local_670._0_8_;
      uStack_398 = local_670._8_8_;
      local_3b0 = 0x3f8000003f800000;
      uStack_3a8 = 0x3f8000003f800000;
      auVar43._8_8_ = 0x3f8000003f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      local_730 = vfmadd213ps_fma(local_670,auVar36 ^ _DAT_01f8f5c0,auVar43);
      local_510._0_4_ = local_670._0_4_;
      local_510._4_4_ = local_670._4_4_;
      uStack_508._0_4_ = local_670._8_4_;
      uStack_508._4_4_ = local_670._12_4_;
      local_740 = (float)local_510 * 1.5707964;
      fStack_73c = local_510._4_4_ * 1.5707964;
      fStack_738 = (float)uStack_508 * 1.5707964;
      fStack_734 = uStack_508._4_4_ * 1.5707964;
      local_430 = &local_720;
      local_438 = local_730;
      local_440 = &local_740;
      local_270 = CONCAT44(fStack_71c,local_720);
      uStack_268 = CONCAT44(fStack_714,fStack_718);
      auVar30._4_4_ = fStack_71c;
      auVar30._0_4_ = local_720;
      auVar30._8_4_ = fStack_718;
      auVar30._12_4_ = fStack_714;
      local_280 = local_730._0_8_;
      uStack_278 = local_730._8_8_;
      local_290 = CONCAT44(fStack_73c,local_740);
      uStack_288 = CONCAT44(fStack_734,fStack_738);
      auVar7._4_4_ = fStack_73c;
      auVar7._0_4_ = local_740;
      auVar7._8_4_ = fStack_738;
      auVar7._12_4_ = fStack_734;
      local_710 = vfmadd213ps_fma(local_730,auVar30,auVar7);
      local_230 = local_710._0_8_;
      uStack_228 = local_710._8_8_;
      local_240 = local_640._0_8_;
      uStack_238 = local_640._8_8_;
      local_1690 = vpor_avx(local_710,local_640);
      local_1550 = local_1610;
      local_1560 = local_1690._0_8_;
      uStack_1558 = local_1690._8_8_;
      *(undefined1 (*) [16])*local_1610 = local_1690;
      local_1610 = (undefined1 (*) [32])(*local_1610 + 0x10);
      local_550 = local_580;
      uStack_548 = uStack_578;
      local_540 = local_590;
      uStack_538 = uStack_588;
      local_520 = local_5b0;
      uStack_518 = uStack_5a8;
      local_510 = local_670._0_8_;
      uStack_508 = local_670._8_8_;
      local_500 = local_620;
      uStack_4f8 = uStack_618;
      local_4e0 = local_6c0._0_8_;
      uStack_4d8 = local_6c0._8_8_;
      local_4c0 = local_4d0;
      uStack_4b8 = uStack_4c8;
      local_4a0 = local_4b0;
      uStack_498 = uStack_4a8;
      local_480 = local_5a0;
      uStack_478 = uStack_598;
      local_3e8 = local_400;
      local_3d0 = local_400;
      local_3b8 = local_400;
      local_260 = local_5a0;
      uStack_258 = uStack_598;
      local_1e0 = local_5b0;
      uStack_1d8 = uStack_5a8;
      local_1c0 = local_580;
      uStack_1b8 = uStack_578;
      local_1b0 = local_590;
      uStack_1a8 = uStack_588;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      uStack_4c = local_50;
      uStack_48 = local_50;
      uStack_44 = local_50;
    }
    for (; local_165c < local_1604; local_165c = local_165c + 1) {
      local_14a8 = local_15e9;
      local_14b0 = local_1610;
      fVar44 = asinf(*(float *)*local_1610);
      *(float *)*local_1610 = fVar44;
      local_1610 = (undefined1 (*) [32])(*local_1610 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}